

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_util.cpp
# Opt level: O1

Vector<double,_std::allocator<double>_> *
amrex::VectorMin(Vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mfs,
                IntVect *param_2,int sComp,int nComp,int nGrow)

{
  double dVar1;
  pointer pdVar2;
  ulong uVar3;
  long lVar4;
  Real RVar5;
  allocator_type local_41;
  int local_40;
  int local_3c;
  ulong local_38;
  
  local_40 = nGrow;
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->super_vector<double,_std::allocator<double>_>,(long)nComp,
             &local_41);
  local_38 = (ulong)(uint)nComp;
  local_3c = nComp;
  if (0 < nComp) {
    uVar3 = 0;
    do {
      RVar5 = MultiFab::min(*(mfs->
                             super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ).
                             super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,(int)uVar3 + sComp,local_40,
                            false);
      (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar3] = RVar5;
      uVar3 = uVar3 + 1;
    } while (local_38 != uVar3);
  }
  if (8 < (long)(mfs->
                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(mfs->
                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 1;
    do {
      if (0 < local_3c) {
        uVar3 = 0;
        do {
          pdVar2 = (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          RVar5 = MultiFab::min((mfs->
                                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                ).
                                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar4],sComp + (int)uVar3,
                                local_40,false);
          dVar1 = pdVar2[uVar3];
          if (dVar1 <= RVar5) {
            RVar5 = dVar1;
          }
          (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar3] = RVar5;
          uVar3 = uVar3 + 1;
        } while (local_38 != uVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (long)(mfs->
                           super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ).
                           super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(mfs->
                           super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ).
                           super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Real>
  VectorMin(const Vector<const MultiFab *>& mfs,
            const IntVect&                  /*tilesize*/,
            int                             sComp,
            int                             nComp,
            int                             nGrow)
  {
    Vector<Real> gMin(nComp);

    for (int n=0; n<nComp; ++n) {
      gMin[n] = mfs[0]->min(sComp+n,nGrow);
    }

    for (int i=1; i<mfs.size(); ++i) {

      for (int n=0; n<nComp; ++n) {
        gMin[n] = std::min(gMin[n], mfs[i]->min(sComp+n,nGrow));
      }
    }

    return gMin;
  }